

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger-inl.h
# Opt level: O0

void __thiscall spdlog::logger::sink_it_(logger *this,log_msg *msg)

{
  bool bVar1;
  element_type *peVar2;
  undefined8 in_RSI;
  long *in_RDI;
  exception *ex;
  shared_ptr<spdlog::sinks::sink> *sink;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *__range1;
  int ignore;
  string_view sv;
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd70;
  level_enum in_stack_fffffffffffffd74;
  sink *in_stack_fffffffffffffd78;
  log_msg *in_stack_fffffffffffffd80;
  logger *in_stack_fffffffffffffd88;
  __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
  local_198;
  long *local_190;
  undefined8 local_188;
  
  local_190 = in_RDI + 5;
  local_188 = in_RSI;
  local_198._M_current =
       (shared_ptr<spdlog::sinks::sink> *)
       std::
       vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
       ::begin(in_stack_fffffffffffffd68);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  ::end(in_stack_fffffffffffffd68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                            (__normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
                             *)in_stack_fffffffffffffd68), bVar1) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator*(&local_198);
    std::__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x3323fa);
    bVar1 = spdlog::sinks::sink::should_log(in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
    if (bVar1) {
      peVar2 = std::
               __shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<spdlog::sinks::sink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x332423);
      (*peVar2->_vptr_sink[2])(peVar2,local_188);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<spdlog::sinks::sink>_*,_std::vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>_>
    ::operator++(&local_198);
  }
  bVar1 = should_flush_(in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  if (bVar1) {
    (**(code **)(*in_RDI + 0x20))();
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger::sink_it_(const details::log_msg &msg) {
    for (auto &sink : sinks_) {
        if (sink->should_log(msg.level)) {
            SPDLOG_TRY { sink->log(msg); }
            SPDLOG_LOGGER_CATCH(msg.source)
        }
    }